

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O0

bool check_phfr_params(CommandOptions *Options,PictureDescriptor *PDesc)

{
  bool bVar1;
  UL local_48;
  Rational local_28;
  Rational rate;
  PictureDescriptor *PDesc_local;
  CommandOptions *Options_local;
  
  rate = (Rational)PDesc;
  local_28 = CommandOptions::PictureRate(Options);
  bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_96);
  if ((((bVar1) &&
       (bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_100), bVar1)) &&
      (bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_120), bVar1)) &&
     (((bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_192), bVar1 &&
       (bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_200), bVar1)) &&
      (bVar1 = ASDCP::Rational::operator!=(&local_28,(Rational *)&ASDCP::EditRate_240), bVar1)))) {
    Options_local._7_1_ = true;
  }
  else if (*(uint *)((long)rate + 0x14) < 0x801) {
    if ((Options->use_smpte_labels & 1U) == 0) {
      fprintf(_stderr,"P-HFR files must be written using SMPTE labels. Use option \'-L\'.\n");
      Options_local._7_1_ = false;
    }
    else {
      bVar1 = Kumu::Identifier<16U>::HasValue(&(Options->picture_coding).super_Identifier<16U>);
      if (!bVar1) {
        ASDCP::UL::UL(&local_48,"\x06\x0e+4\x04\x01\x01\r\x0e\x16\x02\x02\x03\x01\x01\x03");
        ASDCP::UL::operator=(&Options->picture_coding,&local_48);
        ASDCP::UL::~UL(&local_48);
      }
      Options_local._7_1_ = true;
    }
  }
  else {
    fprintf(_stderr,"P-HFR files currently limited to 2K.\n");
    Options_local._7_1_ = false;
  }
  return Options_local._7_1_;
}

Assistant:

bool
check_phfr_params(CommandOptions& Options, JP2K::PictureDescriptor& PDesc)
{
  Rational rate = Options.PictureRate();
  if ( rate != EditRate_96 && rate != EditRate_100 && rate != EditRate_120
       && rate != EditRate_192 && rate != EditRate_200 && rate != EditRate_240 )
    return true;

  if ( PDesc.StoredWidth > 2048 )
    {
      fprintf(stderr, "P-HFR files currently limited to 2K.\n");
      return false;
    }

  if ( ! Options.use_smpte_labels )
    {
      fprintf(stderr, "P-HFR files must be written using SMPTE labels. Use option '-L'.\n");
      return false;
    }

  // do not set the label if the user has already done so
  if ( ! Options.picture_coding.HasValue() )
    Options.picture_coding = UL(P_HFR_UL_2K);

  return true;
}